

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecCorr.c
# Opt level: O2

void Gia_ManCorrPerformRemapping(Vec_Int_t *vPairs,Vec_Ptr_t *vInfo)

{
  uint uVar1;
  int i;
  int i_00;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  uint i_01;
  ulong uVar5;
  
  uVar1 = Vec_PtrReadWordsSimInfo(vInfo);
  uVar5 = (ulong)uVar1;
  i_01 = 0;
  if ((int)uVar1 < 1) {
    uVar5 = 0;
    i_01 = 0;
  }
  do {
    if (vPairs->nSize <= (int)i_01) {
      return;
    }
    i = Vec_IntEntry(vPairs,i_01);
    i_00 = Vec_IntEntry(vPairs,i_01 | 1);
    pvVar2 = Vec_PtrEntry(vInfo,i_00);
    pvVar3 = Vec_PtrEntry(vInfo,i);
    for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
      if (*(int *)((long)pvVar2 + uVar4 * 4) != 0) {
        __assert_fail("pInfoObj[w] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecCorr.c"
                      ,0x197,"void Gia_ManCorrPerformRemapping(Vec_Int_t *, Vec_Ptr_t *)");
      }
      *(undefined4 *)((long)pvVar2 + uVar4 * 4) = *(undefined4 *)((long)pvVar3 + uVar4 * 4);
    }
    i_01 = i_01 + 2;
  } while( true );
}

Assistant:

void Gia_ManCorrPerformRemapping( Vec_Int_t * vPairs, Vec_Ptr_t * vInfo )
{
    unsigned * pInfoObj, * pInfoRepr;
    int w, i, iObj, iRepr, nWords;
    nWords = Vec_PtrReadWordsSimInfo( vInfo );
    Vec_IntForEachEntry( vPairs, iRepr, i )
    {
        iObj = Vec_IntEntry( vPairs, ++i );
        pInfoObj = (unsigned *)Vec_PtrEntry( vInfo, iObj );
        pInfoRepr = (unsigned *)Vec_PtrEntry( vInfo, iRepr );
        for ( w = 0; w < nWords; w++ )
        {
            assert( pInfoObj[w] == 0 );
            pInfoObj[w] = pInfoRepr[w];
        }
    }
}